

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall QCborValue::toCbor(QCborValue *this,QCborStreamWriter *writer,EncodingOptions opt)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  undefined4 in_EDX;
  undefined8 in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  EncodingOptions in_stack_0000001c;
  qsizetype in_stack_00000020;
  QCborContainerPrivate *in_stack_00000028;
  EncodingOptions in_stack_000000bc;
  char *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QCborValue *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isContainer((QCborValue *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if ((bVar2) || (bVar2 = isTag((QCborValue *)0x471801), bVar2)) {
    type(in_RDI);
    encodeToCbor(writer,in_stack_00000028,in_stack_00000020,in_stack_000000bc);
  }
  else if (*(long *)(in_RDI + 8) == 0) {
    bVar2 = isSimpleType((QCborValue *)0x47188a);
    if (bVar2) {
      toSimpleType(in_stack_ffffffffffffffc0,(QCborSimpleType)((ulong)in_RSI >> 0x38));
      QCborStreamWriter::append
                ((QCborStreamWriter *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (QCborSimpleType)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
    }
    else {
      TVar3 = type(in_RDI);
      if (TVar3 != Invalid) {
        if (TVar3 == Integer) {
          QCborStreamWriter::append
                    ((QCborStreamWriter *)(ulong)in_stack_ffffffffffffffb0,
                     (qint64)in_stack_ffffffffffffffa8);
        }
        else {
          if (TVar3 != ByteArray) {
            if (TVar3 == String) {
              QCborStreamWriter::appendTextString
                        ((QCborStreamWriter *)CONCAT44(0x60,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8,0x471a15);
              goto LAB_00471a1b;
            }
            if (((TVar3 == Array) || (TVar3 == Map)) || (TVar3 == Tag)) goto LAB_00471a1b;
            if ((TVar3 != SimpleType) && (3 < (uint)(TVar3 + 0xfffffeec))) {
              if (TVar3 == Double) {
                fp_helper((QCborValue *)CONCAT44(0x202,in_stack_ffffffffffffffb0));
                writeDoubleToCbor((QCborStreamWriter *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),
                                  (double)CONCAT44(in_stack_ffffffffffffffec,in_EDX),
                                  in_stack_0000001c);
              }
              goto LAB_00471a1b;
            }
          }
          QCborStreamWriter::appendByteString
                    ((QCborStreamWriter *)CONCAT44(TVar3,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,0x4719fe);
        }
      }
    }
  }
  else {
    encodeToCbor(writer,in_stack_00000028,in_stack_00000020,in_stack_000000bc);
  }
LAB_00471a1b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void QCborValue::toCbor(QCborStreamWriter &writer, EncodingOptions opt) const
{
    if (isContainer() || isTag())
        return encodeToCbor(writer, container, -type(), opt);
    if (container)
        return encodeToCbor(writer, container, n, opt);

    // very simple types
    if (isSimpleType())
        return writer.append(toSimpleType());

    switch (type()) {
    case Integer:
        return writer.append(n);

    case Double:
        return writeDoubleToCbor(writer, fp_helper(), opt);

    case Invalid:
        return;

    case SimpleType:
    case False:
    case True:
    case Null:
    case Undefined:
        // handled by "if (isSimpleType())"
        Q_UNREACHABLE();
        break;

    case ByteArray:
        // Byte array with no container is empty
        return writer.appendByteString("", 0);

    case String:
        // String with no container is empty
        return writer.appendTextString("", 0);

    case Array:
    case Map:
    case Tag:
        // handled by "if (isContainer() || isTag())"
        Q_UNREACHABLE();
        break;

    case DateTime:
    case Url:
    case RegularExpression:
    case Uuid:
        // not possible
        Q_UNREACHABLE();
        break;
    }
}